

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O3

opj_pi_iterator_t * pi_create_decode_v2(opj_image_t *p_image,opj_cp_v2_t *p_cp,OPJ_UINT32 p_tile_no)

{
  uint uVar1;
  OPJ_PROG_ORDER OVar2;
  opj_tcp_v2_t *poVar3;
  opj_pi_resolution_t *poVar4;
  OPJ_UINT32 *pOVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  OPJ_UINT32 **__ptr;
  OPJ_UINT32 **p_resolutions;
  opj_pi_iterator_t *p_pi;
  short *psVar8;
  opj_image_comp_t *poVar9;
  uint uVar10;
  OPJ_UINT32 OVar11;
  ulong uVar12;
  OPJ_UINT32 *p_tx0;
  int iVar13;
  OPJ_UINT32 **ppOVar14;
  long lVar15;
  int *piVar16;
  int iVar17;
  opj_pi_comp_t *poVar18;
  opj_pi_iterator_t *poVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  OPJ_INT32 l_ty1;
  OPJ_INT32 l_ty0;
  OPJ_INT32 l_tx1;
  OPJ_INT32 l_tx0;
  opj_image_comp_t *local_58;
  ulong local_50;
  ulong local_48;
  OPJ_UINT32 l_dy_min;
  OPJ_UINT32 l_dx_min;
  OPJ_UINT32 l_max_prec;
  OPJ_UINT32 l_max_res;
  
  poVar3 = p_cp->tcps;
  local_50 = (ulong)poVar3[p_tile_no].numpocs;
  uVar7 = p_image->numcomps;
  __ptr = (OPJ_UINT32 **)malloc((ulong)(uVar7 * 0x84) << 2);
  if (__ptr != (OPJ_UINT32 **)0x0) {
    p_resolutions = (OPJ_UINT32 **)malloc((ulong)uVar7 << 3);
    if (p_resolutions != (OPJ_UINT32 **)0x0) {
      p_pi = pi_create(p_image,p_cp,p_tile_no);
      auVar6 = _DAT_00219ba0;
      if (p_pi != (opj_pi_iterator_t *)0x0) {
        poVar3 = poVar3 + p_tile_no;
        uVar20 = (ulong)p_image->numcomps;
        if (uVar20 != 0) {
          lVar15 = uVar20 - 1;
          auVar24._8_4_ = (int)lVar15;
          auVar24._0_8_ = lVar15;
          auVar24._12_4_ = (int)((ulong)lVar15 >> 0x20);
          uVar12 = 0;
          auVar24 = auVar24 ^ _DAT_00219ba0;
          ppOVar14 = __ptr;
          auVar25 = _DAT_00219b90;
          do {
            auVar26._8_4_ = (int)ppOVar14;
            auVar26._0_8_ = ppOVar14;
            auVar26._12_4_ = (int)((ulong)ppOVar14 >> 0x20);
            auVar27 = auVar25 ^ auVar6;
            if ((bool)(~(auVar27._4_4_ == auVar24._4_4_ && auVar24._0_4_ < auVar27._0_4_ ||
                        auVar24._4_4_ < auVar27._4_4_) & 1)) {
              *(OPJ_UINT32 ***)((long)p_resolutions + uVar12) = ppOVar14;
            }
            if ((auVar27._12_4_ != auVar24._12_4_ || auVar27._8_4_ <= auVar24._8_4_) &&
                auVar27._12_4_ <= auVar24._12_4_) {
              *(long *)((long)p_resolutions + uVar12 + 8) = auVar26._8_8_ + 0x210;
            }
            lVar15 = auVar25._8_8_;
            auVar25._0_8_ = auVar25._0_8_ + 2;
            auVar25._8_8_ = lVar15 + 2;
            ppOVar14 = ppOVar14 + 0x84;
            uVar12 = uVar12 + 0x10;
          } while ((uVar20 * 8 + 8 & 0xfffffffffffffff0) != uVar12);
        }
        uVar7 = (int)local_50 + 1;
        p_tx0 = (OPJ_UINT32 *)&l_tx0;
        get_all_encoding_parameters
                  (p_image,p_cp,p_tile_no,(OPJ_INT32 *)p_tx0,&l_tx1,&l_ty0,&l_ty1,&l_dx_min,
                   &l_dy_min,&l_max_prec,&l_max_res,p_resolutions);
        iVar22 = p_image->numcomps * l_max_prec;
        iVar21 = l_max_res * iVar22;
        local_48 = (ulong)poVar3->numlayers;
        psVar8 = (short *)calloc((ulong)((poVar3->numlayers + 1) * iVar21),2);
        p_pi->include = psVar8;
        if (psVar8 == (short *)0x0) {
          free(__ptr);
          free(p_resolutions);
          pi_destroy_v2(p_pi,uVar7);
          return (opj_pi_iterator_t *)0x0;
        }
        poVar18 = p_pi->comps;
        local_58 = p_image->comps;
        p_pi->tx0 = l_tx0;
        p_pi->ty0 = l_ty0;
        p_pi->tx1 = l_tx1;
        p_pi->ty1 = l_ty1;
        p_pi->step_p = 1;
        p_pi->step_c = l_max_prec;
        p_pi->step_r = iVar22;
        p_pi->step_l = iVar21;
        uVar1 = p_pi->numcomps;
        if ((ulong)uVar1 != 0) {
          uVar20 = 0;
          poVar9 = local_58;
          do {
            poVar4 = poVar18->resolutions;
            pOVar5 = p_resolutions[uVar20];
            OVar11 = poVar9->dy;
            poVar18->dx = poVar9->dx;
            poVar18->dy = OVar11;
            p_tx0 = (OPJ_UINT32 *)(ulong)(uint)poVar18->numresolutions;
            if (poVar18->numresolutions != 0) {
              lVar15 = 0;
              do {
                *(undefined4 *)((long)&poVar4->pdx + lVar15) =
                     *(undefined4 *)((long)pOVar5 + lVar15);
                *(undefined4 *)((long)&poVar4->pdy + lVar15) =
                     *(undefined4 *)((long)pOVar5 + lVar15 + 4);
                *(undefined4 *)((long)&poVar4->pw + lVar15) =
                     *(undefined4 *)((long)pOVar5 + lVar15 + 8);
                *(undefined4 *)((long)&poVar4->ph + lVar15) =
                     *(undefined4 *)((long)pOVar5 + lVar15 + 0xc);
                lVar15 = lVar15 + 0x10;
                uVar10 = (int)p_tx0 - 1;
                p_tx0 = (OPJ_UINT32 *)(ulong)uVar10;
              } while (uVar10 != 0);
            }
            poVar18 = poVar18 + 1;
            poVar9 = poVar9 + 1;
            uVar20 = uVar20 + 1;
          } while (uVar20 != uVar1);
        }
        OVar11 = (OPJ_UINT32)p_tx0;
        if (1 < uVar7) {
          poVar19 = p_pi;
          iVar17 = 1;
          do {
            poVar18 = poVar19[1].comps;
            poVar19[1].tx0 = l_tx0;
            poVar19[1].ty0 = l_ty0;
            poVar19[1].tx1 = l_tx1;
            poVar19[1].ty1 = l_ty1;
            poVar19[1].step_p = 1;
            poVar19[1].step_c = l_max_prec;
            poVar19[1].step_r = iVar22;
            poVar19[1].step_l = iVar21;
            uVar7 = poVar19[1].numcomps;
            if ((ulong)uVar7 != 0) {
              uVar20 = 0;
              poVar9 = local_58;
              do {
                poVar4 = poVar18->resolutions;
                p_tx0 = p_resolutions[uVar20];
                OVar11 = poVar9->dy;
                poVar18->dx = poVar9->dx;
                poVar18->dy = OVar11;
                iVar13 = poVar18->numresolutions;
                if (iVar13 != 0) {
                  lVar15 = 0;
                  do {
                    *(undefined4 *)((long)&poVar4->pdx + lVar15) =
                         *(undefined4 *)((long)p_tx0 + lVar15);
                    *(undefined4 *)((long)&poVar4->pdy + lVar15) =
                         *(undefined4 *)((long)p_tx0 + lVar15 + 4);
                    *(undefined4 *)((long)&poVar4->pw + lVar15) =
                         *(undefined4 *)((long)p_tx0 + lVar15 + 8);
                    *(undefined4 *)((long)&poVar4->ph + lVar15) =
                         *(undefined4 *)((long)p_tx0 + lVar15 + 0xc);
                    lVar15 = lVar15 + 0x10;
                    iVar13 = iVar13 + -1;
                  } while (iVar13 != 0);
                }
                poVar18 = poVar18 + 1;
                poVar9 = poVar9 + 1;
                uVar20 = uVar20 + 1;
              } while (uVar20 != uVar7);
            }
            OVar11 = (OPJ_UINT32)p_tx0;
            poVar19[1].include = poVar19->include;
            poVar19 = poVar19 + 1;
            bVar23 = iVar17 != (int)local_50;
            iVar17 = iVar17 + 1;
          } while (bVar23);
        }
        free(__ptr);
        free(p_resolutions);
        if ((poVar3->field_0x1628 & 2) != 0) {
          pi_update_decode_poc(p_pi,poVar3,l_max_prec,OVar11);
          return p_pi;
        }
        if (poVar3->numpocs != 0xffffffff) {
          OVar2 = poVar3->prg;
          piVar16 = &p_pi->first;
          iVar21 = poVar3->numpocs + 1;
          do {
            piVar16[10] = OVar2;
            *(undefined8 *)piVar16 = 1;
            piVar16[2] = 0;
            *(undefined8 *)(piVar16 + 6) = 0;
            piVar16[4] = l_max_res;
            piVar16[5] = piVar16[0x26];
            piVar16[3] = (OPJ_UINT32)local_48;
            piVar16[8] = l_max_prec;
            piVar16 = piVar16 + 0x3e;
            iVar21 = iVar21 + -1;
          } while (iVar21 != 0);
          return p_pi;
        }
        return p_pi;
      }
      free(__ptr);
      __ptr = p_resolutions;
    }
    free(__ptr);
  }
  return (opj_pi_iterator_t *)0x0;
}

Assistant:

opj_pi_iterator_t *pi_create_decode_v2(	opj_image_t *p_image,
										opj_cp_v2_t *p_cp,
										OPJ_UINT32 p_tile_no
										)
{
	// loop
	OPJ_UINT32 pino;
	OPJ_UINT32 compno, resno;

	// to store w, h, dx and dy fro all components and resolutions
	OPJ_UINT32 * l_tmp_data;
	OPJ_UINT32 ** l_tmp_ptr;

	// encoding prameters to set
	OPJ_UINT32 l_max_res;
	OPJ_UINT32 l_max_prec;
	OPJ_INT32 l_tx0,l_tx1,l_ty0,l_ty1;
	OPJ_UINT32 l_dx_min,l_dy_min;
	OPJ_UINT32 l_bound;
	OPJ_UINT32 l_step_p , l_step_c , l_step_r , l_step_l ;
	OPJ_UINT32 l_data_stride;

	// pointers
	opj_pi_iterator_t *l_pi = 00;
	opj_tcp_v2_t *l_tcp = 00;
	const opj_tccp_t *l_tccp = 00;
	opj_pi_comp_t *l_current_comp = 00;
	opj_image_comp_t * l_img_comp = 00;
	opj_pi_iterator_t * l_current_pi = 00;
	OPJ_UINT32 * l_encoding_value_ptr = 00;

	// preconditions in debug
	assert(p_cp != 00);
	assert(p_image != 00);
	assert(p_tile_no < p_cp->tw * p_cp->th);

	// initializations
	l_tcp = &p_cp->tcps[p_tile_no];
	l_bound = l_tcp->numpocs+1;

	l_data_stride = 4 * J2K_MAXRLVLS;
	l_tmp_data = (OPJ_UINT32*)opj_malloc(
		l_data_stride * p_image->numcomps * sizeof(OPJ_UINT32));
	if
		(! l_tmp_data)
	{
		return 00;
	}
	l_tmp_ptr = (OPJ_UINT32**)opj_malloc(
		p_image->numcomps * sizeof(OPJ_UINT32 *));
	if
		(! l_tmp_ptr)
	{
		opj_free(l_tmp_data);
		return 00;
	}

	// memory allocation for pi
	l_pi = pi_create(p_image, p_cp, p_tile_no);
	if (!l_pi) {
		opj_free(l_tmp_data);
		opj_free(l_tmp_ptr);
		return 00;
	}

	l_encoding_value_ptr = l_tmp_data;
	// update pointer array
	for
		(compno = 0; compno < p_image->numcomps; ++compno)
	{
		l_tmp_ptr[compno] = l_encoding_value_ptr;
		l_encoding_value_ptr += l_data_stride;
	}
	// get encoding parameters
	get_all_encoding_parameters(p_image,p_cp,p_tile_no,&l_tx0,&l_tx1,&l_ty0,&l_ty1,&l_dx_min,&l_dy_min,&l_max_prec,&l_max_res,l_tmp_ptr);

	// step calculations
	l_step_p = 1;
	l_step_c = l_max_prec * l_step_p;
	l_step_r = p_image->numcomps * l_step_c;
	l_step_l = l_max_res * l_step_r;

	// set values for first packet iterator
	l_current_pi = l_pi;

	// memory allocation for include
	l_current_pi->include = (OPJ_INT16*) opj_calloc((l_tcp->numlayers +1) * l_step_l, sizeof(OPJ_INT16));
	if
		(!l_current_pi->include)
	{
		opj_free(l_tmp_data);
		opj_free(l_tmp_ptr);
		pi_destroy_v2(l_pi, l_bound);
		return 00;
	}
	memset(l_current_pi->include,0, (l_tcp->numlayers + 1) * l_step_l* sizeof(OPJ_INT16));

	// special treatment for the first packet iterator
	l_current_comp = l_current_pi->comps;
	l_img_comp = p_image->comps;
	l_tccp = l_tcp->tccps;

	l_current_pi->tx0 = l_tx0;
	l_current_pi->ty0 = l_ty0;
	l_current_pi->tx1 = l_tx1;
	l_current_pi->ty1 = l_ty1;

	//l_current_pi->dx = l_img_comp->dx;
	//l_current_pi->dy = l_img_comp->dy;

	l_current_pi->step_p = l_step_p;
	l_current_pi->step_c = l_step_c;
	l_current_pi->step_r = l_step_r;
	l_current_pi->step_l = l_step_l;

	/* allocation for components and number of components has already been calculated by pi_create */
	for
		(compno = 0; compno < l_current_pi->numcomps; ++compno)
	{
		opj_pi_resolution_t *l_res = l_current_comp->resolutions;
		l_encoding_value_ptr = l_tmp_ptr[compno];

		l_current_comp->dx = l_img_comp->dx;
		l_current_comp->dy = l_img_comp->dy;
		/* resolutions have already been initialized */
		for
			(resno = 0; resno < l_current_comp->numresolutions; resno++)
		{
			l_res->pdx = *(l_encoding_value_ptr++);
			l_res->pdy = *(l_encoding_value_ptr++);
			l_res->pw =  *(l_encoding_value_ptr++);
			l_res->ph =  *(l_encoding_value_ptr++);
			++l_res;
		}
		++l_current_comp;
		++l_img_comp;
		++l_tccp;
	}
	++l_current_pi;

	for
		(pino = 1 ; pino<l_bound ; ++pino )
	{
		opj_pi_comp_t *l_current_comp = l_current_pi->comps;
		opj_image_comp_t * l_img_comp = p_image->comps;
		l_tccp = l_tcp->tccps;

		l_current_pi->tx0 = l_tx0;
		l_current_pi->ty0 = l_ty0;
		l_current_pi->tx1 = l_tx1;
		l_current_pi->ty1 = l_ty1;
		//l_current_pi->dx = l_dx_min;
		//l_current_pi->dy = l_dy_min;
		l_current_pi->step_p = l_step_p;
		l_current_pi->step_c = l_step_c;
		l_current_pi->step_r = l_step_r;
		l_current_pi->step_l = l_step_l;

		/* allocation for components and number of components has already been calculated by pi_create */
		for
			(compno = 0; compno < l_current_pi->numcomps; ++compno)
		{
			opj_pi_resolution_t *l_res = l_current_comp->resolutions;
			l_encoding_value_ptr = l_tmp_ptr[compno];

			l_current_comp->dx = l_img_comp->dx;
			l_current_comp->dy = l_img_comp->dy;
			/* resolutions have already been initialized */
			for
				(resno = 0; resno < l_current_comp->numresolutions; resno++)
			{
				l_res->pdx = *(l_encoding_value_ptr++);
				l_res->pdy = *(l_encoding_value_ptr++);
				l_res->pw =  *(l_encoding_value_ptr++);
				l_res->ph =  *(l_encoding_value_ptr++);
				++l_res;
			}
			++l_current_comp;
			++l_img_comp;
			++l_tccp;
		}
		// special treatment
		l_current_pi->include = (l_current_pi-1)->include;
		++l_current_pi;
	}
	opj_free(l_tmp_data);
	l_tmp_data = 00;
	opj_free(l_tmp_ptr);
	l_tmp_ptr = 00;
	if
		(l_tcp->POC)
	{
		pi_update_decode_poc (l_pi,l_tcp,l_max_prec,l_max_res);
	}
	else
	{
		pi_update_decode_not_poc(l_pi,l_tcp,l_max_prec,l_max_res);
	}
	return l_pi;
}